

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product.h
# Opt level: O3

void __thiscall Shoes::~Shoes(Shoes *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Shoes = (_func_int **)&PTR__Shoes_00108c90;
  pcVar1 = (this->type_)._M_dataplus._M_p;
  paVar2 = &(this->type_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->param_).type._M_dataplus._M_p;
  paVar2 = &(this->param_).type.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->param_).color._M_dataplus._M_p;
  paVar2 = &(this->param_).color.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Shoes() {}